

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::seekValueCase
          (string *__return_storage_ptr__,CppGenerator *this,size_t depth,string *rel_name,
          string *attr_name,bool parallel)

{
  size_t off;
  size_t off_00;
  CppGenerator *this_00;
  string local_a70;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  string local_970;
  string local_950;
  string local_930;
  string local_910;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  string local_830;
  string local_810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  offset_abi_cxx11_(&local_50,this,depth + 4);
  std::operator+(&local_7f0,&local_50,"case ");
  std::operator+(&local_7d0,&local_7f0,rel_name);
  std::operator+(&local_7b0,&local_7d0,"_ID:\n");
  off = depth + 5;
  offset_abi_cxx11_(&local_810,this,off);
  std::operator+(&local_790,&local_7b0,&local_810);
  std::operator+(&local_770,&local_790,"if(");
  std::operator+(&local_750,&local_770,rel_name);
  std::operator+(&local_730,&local_750,"[lowerptr_");
  std::operator+(&local_710,&local_730,rel_name);
  std::operator+(&local_6f0,&local_710,"[");
  std::__cxx11::to_string(&local_830,depth);
  std::operator+(&local_6d0,&local_6f0,&local_830);
  std::operator+(&local_6b0,&local_6d0,"]].");
  std::operator+(&local_690,&local_6b0,attr_name);
  std::operator+(&local_670,&local_690," == max_");
  std::operator+(&local_650,&local_670,attr_name);
  std::operator+(&local_630,&local_650,")\n");
  off_00 = depth + 6;
  offset_abi_cxx11_(&local_850,this,off_00);
  std::operator+(&local_610,&local_630,&local_850);
  std::operator+(&local_5f0,&local_610,"found[");
  std::__cxx11::to_string(&local_870,depth);
  std::operator+(&local_5d0,&local_5f0,&local_870);
  std::operator+(&local_5b0,&local_5d0,"] = true;\n");
  offset_abi_cxx11_(&local_890,this,off);
  std::operator+(&local_590,&local_5b0,&local_890);
  std::operator+(&local_570,&local_590,"else if(max_");
  std::operator+(&local_550,&local_570,attr_name);
  std::operator+(&local_530,&local_550," > ");
  std::operator+(&local_510,&local_530,rel_name);
  std::operator+(&local_4f0,&local_510,"[");
  this_00 = (CppGenerator *)rel_name;
  std::__cxx11::string::string((string *)&local_8d0,(string *)rel_name);
  getUpperPointer(&local_8b0,this_00,&local_8d0,depth,parallel);
  std::operator+(&local_4d0,&local_4f0,&local_8b0);
  std::operator+(&local_4b0,&local_4d0,"].");
  std::operator+(&local_490,&local_4b0,attr_name);
  std::operator+(&local_470,&local_490,")\n");
  offset_abi_cxx11_(&local_8f0,this,off_00);
  std::operator+(&local_450,&local_470,&local_8f0);
  std::operator+(&local_430,&local_450,"atEnd[");
  std::__cxx11::to_string(&local_910,depth);
  std::operator+(&local_410,&local_430,&local_910);
  std::operator+(&local_3f0,&local_410,"] = true;\n");
  offset_abi_cxx11_(&local_930,this,off);
  std::operator+(&local_3d0,&local_3f0,&local_930);
  std::operator+(&local_3b0,&local_3d0,"else\n");
  offset_abi_cxx11_(&local_950,this,off);
  std::operator+(&local_390,&local_3b0,&local_950);
  std::operator+(&local_370,&local_390,"{\n");
  genFindUpperBound(&local_970,this,rel_name,attr_name,depth,parallel);
  std::operator+(&local_350,&local_370,&local_970);
  offset_abi_cxx11_(&local_990,this,off_00);
  std::operator+(&local_330,&local_350,&local_990);
  std::operator+(&local_310,&local_330,"max_");
  std::operator+(&local_2f0,&local_310,attr_name);
  std::operator+(&local_2d0,&local_2f0," = ");
  std::operator+(&local_2b0,&local_2d0,rel_name);
  std::operator+(&local_290,&local_2b0,"[lowerptr_");
  std::operator+(&local_270,&local_290,rel_name);
  std::operator+(&local_250,&local_270,"[");
  std::__cxx11::to_string(&local_9b0,depth);
  std::operator+(&local_230,&local_250,&local_9b0);
  std::operator+(&local_210,&local_230,"]].");
  std::operator+(&local_1f0,&local_210,attr_name);
  std::operator+(&local_1d0,&local_1f0,";\n");
  offset_abi_cxx11_(&local_9d0,this,off_00);
  std::operator+(&local_1b0,&local_1d0,&local_9d0);
  std::operator+(&local_190,&local_1b0,"rel[");
  std::__cxx11::to_string(&local_9f0,depth);
  std::operator+(&local_170,&local_190,&local_9f0);
  std::operator+(&local_150,&local_170,"] = (rel[");
  std::__cxx11::to_string(&local_a10,depth);
  std::operator+(&local_130,&local_150,&local_a10);
  std::operator+(&local_110,&local_130,"]+1) % numOfRel[");
  std::__cxx11::to_string(&local_a30,depth);
  std::operator+(&local_f0,&local_110,&local_a30);
  std::operator+(&local_d0,&local_f0,"];\n");
  offset_abi_cxx11_(&local_a50,this,off);
  std::operator+(&local_b0,&local_d0,&local_a50);
  std::operator+(&local_90,&local_b0,"}\n");
  offset_abi_cxx11_(&local_a70,this,off);
  std::operator+(&local_70,&local_90,&local_a70);
  std::operator+(__return_storage_ptr__,&local_70,"break;\n");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_a70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_930);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_910);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_8f0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_8b0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::__cxx11::string::~string((string *)&local_570);
  std::__cxx11::string::~string((string *)&local_590);
  std::__cxx11::string::~string((string *)&local_890);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::__cxx11::string::~string((string *)&local_870);
  std::__cxx11::string::~string((string *)&local_5f0);
  std::__cxx11::string::~string((string *)&local_610);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_630);
  std::__cxx11::string::~string((string *)&local_650);
  std::__cxx11::string::~string((string *)&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  std::__cxx11::string::~string((string *)&local_6d0);
  std::__cxx11::string::~string((string *)&local_830);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::__cxx11::string::~string((string *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  std::__cxx11::string::~string((string *)&local_750);
  std::__cxx11::string::~string((string *)&local_770);
  std::__cxx11::string::~string((string *)&local_790);
  std::__cxx11::string::~string((string *)&local_810);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::__cxx11::string::~string((string *)&local_7d0);
  std::__cxx11::string::~string((string *)&local_7f0);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::seekValueCase(size_t depth, const std::string& rel_name,
                                        const std::string& attr_name,
                                        bool parallel)
{
    return offset(4+depth)+"case "+rel_name+"_ID:\n"+
        //if
        offset(5+depth)+"if("+rel_name+"[lowerptr_"+rel_name+"["+
        std::to_string(depth)+"]]."+attr_name+" == max_"+attr_name+")\n"+
        offset(6+depth)+"found["+std::to_string(depth)+"] = true;\n"+
        // else if 
        offset(5+depth)+"else if(max_"+attr_name+" > "+rel_name+"["+
        getUpperPointer(rel_name, depth, parallel)+"]."+attr_name+")\n"+
        offset(6+depth)+"atEnd["+std::to_string(depth)+"] = true;\n"+
        //else 
        offset(5+depth)+"else\n"+offset(5+depth)+"{\n"+
        /* Calling genFindUpperBound Function */
        genFindUpperBound(rel_name,attr_name,depth, parallel)+
        // offset(6+depth)+"findUpperBound("+rel_name+",&"+rel_name+"_tuple::"+
        // attr_name+", max_"+attr_name+",lowerptr_"+rel_name+"["+
        // std::to_string(depth)+"],"+getUpperPointer(rel_name,depth,parallel)+");\n"+
        offset(6+depth)+"max_"+attr_name+" = "+rel_name+"[lowerptr_"+
        rel_name+"["+std::to_string(depth)+"]]."+attr_name+";\n"+
        offset(6+depth)+"rel["+std::to_string(depth)+"] = (rel["+
        std::to_string(depth)+"]+1) % numOfRel["+std::to_string(depth)+"];\n"+
        offset(5+depth)+"}\n"+
        //break
        offset(5+depth)+"break;\n";
}